

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZX8081.cpp
# Opt level: O3

shared_ptr<Storage::Data::ZX8081::File> __thiscall
Storage::Data::ZX8081::FileFromData
          (ZX8081 *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  ushort uVar1;
  pointer puVar2;
  undefined8 *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  long lVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  bool bVar8;
  shared_ptr<Storage::Data::ZX8081::File> sVar9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> name_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  wstring local_50;
  
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar2 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_finish + -(long)puVar2);
  if (p_Var4 < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xc) {
    lVar7 = 0;
  }
  else {
    p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xa;
    lVar7 = 1;
    do {
      local_50._M_dataplus._M_p._0_1_ = puVar2[lVar7 + -1] & 0x3f;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&local_68,(uchar *)&local_50);
      puVar2 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((char)puVar2[lVar7 + -1] < '\0') {
        lVar7 = lVar7 + -1;
LAB_0042bb6d:
        _Var5._M_pi = extraout_RDX;
        if (p_Var6 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0042bb96;
        p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_finish + -(long)puVar2);
        goto LAB_0042bb79;
      }
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish + -(long)puVar2);
      if (p_Var4 <= p_Var6) goto LAB_0042bb6d;
      lVar7 = lVar7 + 1;
      bVar8 = p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)&p_Var6[-1]._M_weak_count + 3)
      ;
    } while (bVar8);
    lVar7 = 0xb;
  }
LAB_0042bb79:
  _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(lVar7 + 0x56);
  if ((p_Var4 < _Var5._M_pi) ||
     (p_Var4 < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (((ulong)*(ushort *)(puVar2 + lVar7 + 0xc) + lVar7) - 0x4008))) {
LAB_0042bb96:
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
    p_Var6->_M_use_count = 1;
    p_Var6->_M_weak_count = 1;
    p_Var6->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_005a1f80;
    p_Var6[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var6[2]._M_use_count = 0;
    p_Var6[2]._M_weak_count = 0;
    p_Var6[1]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var6[1]._M_use_count = 0;
    p_Var6[1]._M_weak_count = 0;
    p_Var6[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var6[3]._M_use_count = 0;
    p_Var6[3]._M_weak_count = 0;
    p_Var6[4]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var6[4]._M_use_count = 0;
    p_Var6[4]._M_weak_count = 0;
    *(_Atomic_word **)&p_Var6[2]._M_use_count = &p_Var6[3]._M_use_count;
    StringFromData_abi_cxx11_
              (&local_50,(ZX8081 *)&local_68,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1,SUB81(p_Var4,0));
    p_Var4 = p_Var6 + 1;
    std::__cxx11::wstring::operator=((wstring *)&p_Var6[2]._M_use_count,(wstring *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)CONCAT71(local_50._M_dataplus._M_p._1_7_,(byte)local_50._M_dataplus._M_p) !=
        &local_50.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_50._M_dataplus._M_p._1_7_,(byte)local_50._M_dataplus._M_p),
                      local_50.field_2._M_allocated_capacity * 4 + 4);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)p_Var4,data);
    *(undefined1 *)&p_Var6[4]._M_use_count = 1;
    _Var5._M_pi = extraout_RDX_00;
  }
  if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    _Var5._M_pi = extraout_RDX_01;
  }
  if (p_Var4 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    puVar2 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                   .super__Vector_impl_data._M_finish + -(long)puVar2);
    if ((((_Var5._M_pi < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x28) ||
         (uVar1 = *(ushort *)(puVar2 + 10),
         _Var5._M_pi < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((ulong)uVar1 - 0x4000))) ||
        (uVar1 < *(ushort *)(puVar2 + 8))) || (*(ushort *)(puVar2 + 0xc) < uVar1)) {
      *(undefined8 *)this = 0;
      *(undefined8 *)(this + 8) = 0;
    }
    else {
      puVar3 = (undefined8 *)operator_new(0x50);
      puVar3[1] = 0x100000001;
      *puVar3 = &PTR___Sp_counted_ptr_inplace_005a1f80;
      puVar3[4] = 0;
      puVar3[5] = 0;
      puVar3[2] = 0;
      puVar3[3] = 0;
      puVar3[6] = 0;
      puVar3[7] = 0;
      puVar3[8] = 0;
      puVar3[9] = 0;
      puVar3[5] = puVar3 + 7;
      *(undefined8 **)(this + 8) = puVar3;
      *(vector<unsigned_char,_std::allocator<unsigned_char>_> **)this =
           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(puVar3 + 2);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(puVar3 + 2),data);
      *(undefined1 *)(puVar3 + 9) = 0;
      _Var5._M_pi = extraout_RDX_03;
    }
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
      _Var5._M_pi = extraout_RDX_02;
    }
  }
  else {
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)this = p_Var4;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var6;
  }
  sVar9.super___shared_ptr<Storage::Data::ZX8081::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var5._M_pi;
  sVar9.super___shared_ptr<Storage::Data::ZX8081::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Storage::Data::ZX8081::File>)
         sVar9.super___shared_ptr<Storage::Data::ZX8081::File,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<File> Storage::Data::ZX8081::FileFromData(const std::vector<uint8_t> &data) {
	std::shared_ptr<Storage::Data::ZX8081::File> result = ZX81FileFromData(data);
	if(result) return result;
	return ZX80FileFromData(data);
}